

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test7::generateXFBVaryingNames(GPUShaderFP64Test7 *this,_variables *variables)

{
  _variable *variable;
  pointer p_Var1;
  GLchar **ppGVar2;
  ostream *poVar3;
  GLchar *pGVar4;
  pointer p_Var5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  stringstream varying_sstream;
  long *local_1f0;
  size_t local_1e8;
  long local_1e0 [2];
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if (this->m_xfb_varyings != (GLchar **)0x0) {
    releaseXFBVaryingNames(this);
  }
  uVar7 = 0;
  for (p_Var1 = (variables->
                super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                )._M_impl.super__Vector_impl_data._M_start;
      p_Var1 != (variables->
                super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                )._M_impl.super__Vector_impl_data._M_finish; p_Var1 = p_Var1 + 1) {
    uVar7 = uVar7 + p_Var1->array_size;
  }
  ppGVar2 = (GLchar **)operator_new__((ulong)uVar7 << 3);
  this->m_xfb_varyings = ppGVar2;
  p_Var1 = (variables->
           super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
           )._M_impl.super__Vector_impl_data._M_start;
  p_Var5 = (variables->
           super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var1 != p_Var5) {
    local_1d0 = 0;
    uVar8 = 0;
    do {
      if (p_Var1->array_size != 0) {
        local_1c8 = (ulong)uVar8;
        uVar9 = 0;
        local_1c0 = local_1d0;
        do {
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"gs_variable",0xb)
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          if (1 < p_Var1->array_size) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
          }
          std::__cxx11::stringbuf::str();
          if (local_1f0 != local_1e0) {
            operator_delete(local_1f0,local_1e0[0] + 1);
          }
          pGVar4 = (GLchar *)operator_new__(local_1e8 + 1);
          uVar6 = (int)local_1c8 + (int)uVar9;
          this->m_xfb_varyings[uVar6] = pGVar4;
          pGVar4 = this->m_xfb_varyings[uVar6];
          std::__cxx11::stringbuf::str();
          memcpy(pGVar4,local_1f0,local_1e8);
          if (local_1f0 != local_1e0) {
            operator_delete(local_1f0,local_1e0[0] + 1);
          }
          this->m_xfb_varyings[uVar6][local_1e8] = '\0';
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          uVar9 = uVar9 + 1;
        } while (uVar9 < p_Var1->array_size);
        p_Var5 = (variables->
                 super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        uVar8 = uVar8 + (int)uVar9;
      }
      p_Var1 = p_Var1 + 1;
      local_1d0 = (ulong)((int)local_1d0 + 1);
    } while (p_Var1 != p_Var5);
  }
  this->m_n_xfb_varyings = uVar7;
  return;
}

Assistant:

void GPUShaderFP64Test7::generateXFBVaryingNames(const _variables& variables)
{
	unsigned int n_variable = 0;
	unsigned int n_varying  = 0;
	unsigned int n_varyings = 0;

	if (m_xfb_varyings != NULL)
	{
		releaseXFBVaryingNames();
	}

	for (_variables_const_iterator variables_iterator = variables.begin(); variables_iterator != variables.end();
		 ++variables_iterator)
	{
		const _variable& variable = *variables_iterator;

		n_varyings += variable.array_size;
	}

	m_xfb_varyings = new glw::GLchar*[n_varyings];

	for (_variables_const_iterator variables_iterator = variables.begin(); variables_iterator != variables.end();
		 ++variables_iterator, ++n_variable)
	{
		const _variable& variable = *variables_iterator;

		for (unsigned int array_index = 0; array_index < variable.array_size; ++array_index, ++n_varying)
		{
			std::stringstream varying_sstream;
			size_t			  varying_length;

			varying_sstream << "gs_variable" << n_variable;

			if (variable.array_size > 1)
			{
				varying_sstream << "[" << array_index << "]";
			}

			/* Store the varying name */
			varying_length			  = varying_sstream.str().length();
			m_xfb_varyings[n_varying] = new glw::GLchar[varying_length + 1 /* terminator */];

			memcpy(m_xfb_varyings[n_varying], varying_sstream.str().c_str(), varying_length);
			m_xfb_varyings[n_varying][varying_length] = 0;
		} /* for (all array indices) */
	}	 /* for (all varyings) */

	m_n_xfb_varyings = n_varyings;
}